

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O1

uchar getUnOpcode(TokenType type)

{
  uchar uVar1;
  ostream *poVar2;
  string local_38;
  
  if ((int)type < 9) {
    if (type == Ampersand) {
      uVar1 = 's';
    }
    else {
      uVar1 = 'q';
      if (type != Plus) {
LAB_0010bc32:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Token ",6);
        tokTypeToString_abi_cxx11_(&local_38,type);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_38._M_dataplus._M_p,
                            local_38._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2," has no unary opcode translation.",0x21);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&local_38);
        exit(1);
      }
    }
  }
  else if (type == Bang) {
    uVar1 = 'r';
  }
  else {
    if (type != Minus) goto LAB_0010bc32;
    uVar1 = 'p';
  }
  return uVar1;
}

Assistant:

inline constexpr unsigned char getUnOpcode(TokenType type) {
    switch (type) {
        case TokenType::Plus:
            return Opcode::POS;
        case TokenType::Minus:
            return Opcode::NEG;
        case TokenType::Bang:
            return Opcode::NOT;
        case TokenType::Ampersand:
            return Opcode::STRFY;
        default:
            // this should never happen
            std::cout << "Token " << tokTypeToString(type) << " has no unary opcode translation." << std::endl;
            exit(1);
    }
}